

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseTree.cpp
# Opt level: O0

SynBase * ParseType(ParseContext *ctx,bool *shrBorrow,bool onlyType)

{
  IntrusiveList<SynBase> arguments_00;
  IntrusiveList<SynBase> sizes_00;
  bool bVar1;
  bool *pbVar2;
  SynBase *node;
  SynBase *pSVar3;
  Lexeme *pLVar4;
  ParseContext *this;
  SynTypeFunction *pSVar5;
  Lexeme *pLVar6;
  Lexeme *local_d8;
  bool local_b2;
  byte local_b1;
  SynBase *argument;
  IntrusiveList<SynBase> arguments;
  Lexeme *refLexeme;
  bool local_6d;
  uint local_6c;
  bool hasClose;
  SynBase *pSStack_68;
  SynBase *size;
  Lexeme *sizeStart;
  IntrusiveList<SynBase> sizes;
  SynTypeFunction *local_40;
  SynBase *base;
  bool shrBorrowTerminal;
  Lexeme *pLStack_30;
  Lexeme *start;
  bool *pbStack_20;
  bool onlyType_local;
  bool *shrBorrow_local;
  ParseContext *ctx_local;
  
  pLStack_30 = ctx->currentLexeme;
  base._4_4_ = (int)((long)pLStack_30 - (long)ctx->firstLexeme >> 5) + 1;
  start._7_1_ = onlyType;
  pbStack_20 = shrBorrow;
  shrBorrow_local = (bool *)ctx;
  pbVar2 = SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::find
                     (&ctx->nonTypeLocations,(uint *)((long)&base + 4));
  if (pbVar2 == (bool *)0x0) {
    if (pbStack_20 == (bool *)0x0) {
      local_b1 = 0;
    }
    else {
      local_b1 = *pbStack_20;
    }
    base._3_1_ = local_b1 & 1;
    local_40 = (SynTypeFunction *)
               ParseTerminalType((ParseContext *)shrBorrow_local,(bool *)((long)&base + 3));
    if (local_40 == (SynTypeFunction *)0x0) {
      ctx_local = (ParseContext *)0x0;
    }
    else {
      if ((base._3_1_ & 1) != 0) {
        if (pbStack_20 == (bool *)0x0) {
          *(Lexeme **)(shrBorrow_local + 0x440) = pLStack_30;
          sizes.tail._4_4_ = (int)((long)pLStack_30 - *(long *)(shrBorrow_local + 0x438) >> 5) + 1;
          sizes.tail._3_1_ = 1;
          SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
                    ((SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *)
                     (shrBorrow_local + 0xe08),(uint *)((long)&sizes.tail + 4),
                     (bool *)((long)&sizes.tail + 3));
          return (SynBase *)0x0;
        }
        *pbStack_20 = true;
      }
LAB_00294b17:
      while( true ) {
        do {
          while( true ) {
            bVar1 = ParseContext::At((ParseContext *)shrBorrow_local,lex_obracket);
            local_b2 = true;
            if (!bVar1) {
              local_b2 = ParseContext::At((ParseContext *)shrBorrow_local,lex_ref);
            }
            if (local_b2 == false) {
              return &local_40->super_SynBase;
            }
            bVar1 = ParseContext::At((ParseContext *)shrBorrow_local,lex_obracket);
            if (!bVar1) break;
            IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)&sizeStart);
            while (bVar1 = ParseContext::Consume((ParseContext *)shrBorrow_local,lex_obracket),
                  bVar1) {
              size = *(SynBase **)(shrBorrow_local + 0x440);
              pSStack_68 = ParseTernaryExpr((ParseContext *)shrBorrow_local);
              if ((pSStack_68 != (SynBase *)0x0) &&
                 (bVar1 = ParseContext::At((ParseContext *)shrBorrow_local,lex_cbracket),
                 pbVar2 = shrBorrow_local, !bVar1)) {
                if ((start._7_1_ & 1) != 0) {
                  pLVar4 = ParseContext::Current((ParseContext *)shrBorrow_local);
                  anon_unknown.dwarf_11716f::Report
                            ((ParseContext *)pbVar2,pLVar4,"ERROR: \']\' not found after expression"
                            );
                }
                *(Lexeme **)(shrBorrow_local + 0x440) = pLStack_30;
                local_6c = (int)((long)pLStack_30 - *(long *)(shrBorrow_local + 0x438) >> 5) + 1;
                local_6d = true;
                SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U>::insert
                          ((SmallDenseMap<unsigned_int,_bool,_SmallDenseMapUnsignedHasher,_128U> *)
                           (shrBorrow_local + 0xe08),&local_6c,&local_6d);
                return (SynBase *)0x0;
              }
              bVar1 = anon_unknown.dwarf_11716f::CheckConsume
                                ((ParseContext *)shrBorrow_local,lex_cbracket,
                                 "ERROR: matching \']\' not found");
              if (pSStack_68 == (SynBase *)0x0) {
                node = &ParseContext::get<SynNothing>((ParseContext *)shrBorrow_local)->
                        super_SynBase;
                pSVar3 = size;
                if (bVar1) {
                  local_d8 = ParseContext::Previous((ParseContext *)shrBorrow_local);
                }
                else {
                  local_d8 = ParseContext::Current((ParseContext *)shrBorrow_local);
                }
                SynNothing::SynNothing((SynNothing *)node,(Lexeme *)pSVar3,local_d8);
                IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&sizeStart,node);
              }
              else {
                IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&sizeStart,pSStack_68);
              }
            }
            pSVar5 = (SynTypeFunction *)
                     ParseContext::get<SynTypeArray>((ParseContext *)shrBorrow_local);
            pLVar4 = pLStack_30;
            pLVar6 = ParseContext::Previous((ParseContext *)shrBorrow_local);
            sizes_00.tail = sizes.head;
            sizes_00.head = (SynBase *)sizeStart;
            SynTypeArray::SynTypeArray
                      ((SynTypeArray *)pSVar5,pLVar4,pLVar6,&local_40->super_SynBase,sizes_00);
            local_40 = pSVar5;
          }
          bVar1 = ParseContext::Consume((ParseContext *)shrBorrow_local,lex_ref);
        } while (!bVar1);
        arguments.tail = *(SynBase **)(shrBorrow_local + 0x440);
        bVar1 = ParseContext::Consume((ParseContext *)shrBorrow_local,lex_oparen);
        if (bVar1) break;
        pSVar5 = (SynTypeFunction *)
                 ParseContext::get<SynTypeReference>((ParseContext *)shrBorrow_local);
        pLVar4 = pLStack_30;
        pLVar6 = ParseContext::Previous((ParseContext *)shrBorrow_local);
        SynTypeReference::SynTypeReference
                  ((SynTypeReference *)pSVar5,pLVar4,pLVar6,&local_40->super_SynBase);
        local_40 = pSVar5;
      }
      IntrusiveList<SynBase>::IntrusiveList((IntrusiveList<SynBase> *)&argument);
      pSVar3 = ParseType((ParseContext *)shrBorrow_local,(bool *)0x0,false);
      if (pSVar3 != (SynBase *)0x0) {
        IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&argument,pSVar3);
        while (bVar1 = ParseContext::Consume((ParseContext *)shrBorrow_local,lex_comma), bVar1) {
          pSVar3 = ParseType((ParseContext *)shrBorrow_local,(bool *)0x0,false);
          pbVar2 = shrBorrow_local;
          if (pSVar3 == (SynBase *)0x0) {
            pLVar4 = ParseContext::Current((ParseContext *)shrBorrow_local);
            anon_unknown.dwarf_11716f::Report
                      ((ParseContext *)pbVar2,pLVar4,"ERROR: type is expected after \',\'");
            break;
          }
          IntrusiveList<SynBase>::push_back((IntrusiveList<SynBase> *)&argument,pSVar3);
        }
      }
      bVar1 = ParseContext::Consume((ParseContext *)shrBorrow_local,lex_cparen);
      if (bVar1) {
        pSVar5 = ParseContext::get<SynTypeFunction>((ParseContext *)shrBorrow_local);
        pLVar4 = pLStack_30;
        pLVar6 = ParseContext::Previous((ParseContext *)shrBorrow_local);
        arguments_00.tail = arguments.head;
        arguments_00.head = argument;
        SynTypeFunction::SynTypeFunction(pSVar5,pLVar4,pLVar6,&local_40->super_SynBase,arguments_00)
        ;
        local_40 = pSVar5;
        goto LAB_00294b17;
      }
      *(SynBase **)(shrBorrow_local + 0x440) = arguments.tail;
      this = (ParseContext *)ParseContext::get<SynTypeReference>((ParseContext *)shrBorrow_local);
      pLVar4 = pLStack_30;
      pLVar6 = ParseContext::Previous((ParseContext *)shrBorrow_local);
      SynTypeReference::SynTypeReference
                ((SynTypeReference *)this,pLVar4,pLVar6,&local_40->super_SynBase);
      ctx_local = this;
    }
  }
  else {
    ctx_local = (ParseContext *)0x0;
  }
  return (SynBase *)ctx_local;
}

Assistant:

SynBase* ParseType(ParseContext &ctx, bool *shrBorrow, bool onlyType)
{
	Lexeme *start = ctx.currentLexeme;

	if(ctx.nonTypeLocations.find(unsigned(start - ctx.firstLexeme) + 1))
		return NULL;

	bool shrBorrowTerminal = shrBorrow ? *shrBorrow : false;

	SynBase *base = ParseTerminalType(ctx, shrBorrowTerminal);
	
	if(!base)
		return NULL;

	if(shrBorrowTerminal)
	{
		if(!shrBorrow)
		{
			// Backtrack
			ctx.currentLexeme = start;
			ctx.nonTypeLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

			return NULL;
		}
		else
		{
			*shrBorrow = true;
		}
	}

	while(ctx.At(lex_obracket) || ctx.At(lex_ref))
	{
		if(ctx.At(lex_obracket))
		{
			IntrusiveList<SynBase> sizes;

			while(ctx.Consume(lex_obracket))
			{
				Lexeme *sizeStart = ctx.currentLexeme;

				SynBase *size = ParseTernaryExpr(ctx);

				if(size && !ctx.At(lex_cbracket))
				{
					if(onlyType)
						Report(ctx, ctx.Current(), "ERROR: ']' not found after expression");

					// Backtrack
					ctx.currentLexeme = start;
					ctx.nonTypeLocations.insert(unsigned(start - ctx.firstLexeme) + 1, true);

					return NULL;
				}

				bool hasClose = CheckConsume(ctx, lex_cbracket, "ERROR: matching ']' not found");

				if(size)
					sizes.push_back(size);
				else
					sizes.push_back(new (ctx.get<SynNothing>()) SynNothing(sizeStart, hasClose ? ctx.Previous() : ctx.Current()));
			}

			base = new (ctx.get<SynTypeArray>()) SynTypeArray(start, ctx.Previous(), base, sizes);
		}
		else if(ctx.Consume(lex_ref))
		{
			Lexeme *refLexeme = ctx.currentLexeme;

			if(ctx.Consume(lex_oparen))
			{
				IntrusiveList<SynBase> arguments;

				if(SynBase *argument = ParseType(ctx))
				{
					arguments.push_back(argument);

					while(ctx.Consume(lex_comma))
					{
						argument = ParseType(ctx);

						if(!argument)
						{
							Report(ctx, ctx.Current(), "ERROR: type is expected after ','");

							break;
						}

						arguments.push_back(argument);
					}
				}

				if(!ctx.Consume(lex_cparen))
				{
					// Backtrack
					ctx.currentLexeme = refLexeme;

					return new (ctx.get<SynTypeReference>()) SynTypeReference(start, ctx.Previous(), base);
				}

				base = new (ctx.get<SynTypeFunction>()) SynTypeFunction(start, ctx.Previous(), base, arguments);
			}
			else
			{
				base = new (ctx.get<SynTypeReference>()) SynTypeReference(start, ctx.Previous(), base);
			}
		}
	}

	return base;
}